

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clone.cpp
# Opt level: O0

void __thiscall
Clone_componentWithResets_Test::~Clone_componentWithResets_Test
          (Clone_componentWithResets_Test *this)

{
  Clone_componentWithResets_Test *this_local;
  
  ~Clone_componentWithResets_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Clone, componentWithResets)
{
    auto c = libcellml::Component::create();
    auto r1 = libcellml::Reset::create();
    auto r2 = libcellml::Reset::create();

    c->setId("unique");
    c->setName("copy");

    c->addReset(r1);
    c->addReset(r2);

    auto cClone = c->clone();

    compareComponent(c, cClone);
}